

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

int DoInclude(int dummy)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  char *__dest;
  char *str;
  
  str = Line2;
  if (including == '\x01') {
    Printf("Sorry, can\'t nest includes\n");
  }
  else {
    iVar7 = strncasecmp(Line2,"notext",6);
    if ((iVar7 == 0) && (str[6] != '\0')) {
      iVar7 = isspace((int)str[6]);
      if (iVar7 != 0) {
        includenotext = 1;
        str = skipwhite(str + 7);
        Line2 = str;
      }
    }
    stripwhite(str);
    cVar5 = *str;
    if (cVar5 == '\"') {
      str = str + 1;
      for (pcVar8 = str; (*pcVar8 != '\0' && (*pcVar8 != '\"')); pcVar8 = pcVar8 + 1) {
      }
      Line2 = str;
      *pcVar8 = '\0';
      cVar5 = *str;
    }
    if (cVar5 == '\0') {
      Printf("Include directive is missing filename\n");
    }
    else {
      DPrintf(4,"Including %s\n",str);
      pcVar4 = PatchPt;
      iVar3 = dversion;
      iVar2 = pversion;
      pcVar1 = PatchFile;
      pcVar8 = PatchName;
      iVar7 = PatchSize;
      including = 1;
      __dest = str;
      if (PatchName != (char *)0x0) {
        pcVar9 = strrchr(PatchName,0x2f);
        if (pcVar9 != (char *)0x0) {
          sVar10 = strlen(str);
          __dest = (char *)operator_new__((ulong)(pcVar9 + (sVar10 - (long)pcVar8) + 2));
          strncpy(__dest,pcVar8,(size_t)(pcVar9 + (1 - (long)pcVar8)));
          strcpy(__dest + (long)(pcVar9 + (1 - (long)pcVar8)),str);
          bVar6 = FileExists(__dest);
          if (!bVar6) {
            operator_delete__(__dest);
            __dest = str;
          }
        }
      }
      D_LoadDehFile(__dest);
      if (str != __dest) {
        operator_delete__(__dest);
      }
      DPrintf(4,"Done with include\n");
      PatchSize = iVar7;
      PatchName = pcVar8;
      PatchFile = pcVar1;
      pversion = iVar2;
      dversion = iVar3;
      PatchPt = pcVar4;
    }
    including = '\0';
    includenotext = 0;
  }
  iVar7 = GetLine();
  return iVar7;
}

Assistant:

static int DoInclude (int dummy)
{
	char *data;
	int savedversion, savepversion, savepatchsize;
	char *savepatchfile, *savepatchpt, *savepatchname;

	if (including)
	{
		Printf ("Sorry, can't nest includes\n");
		return GetLine();
	}

	if (strnicmp (Line2, "notext", 6) == 0 && Line2[6] != 0 && isspace(Line2[6]))
	{
		includenotext = true;
		Line2 = skipwhite (Line2+7);
	}

	stripwhite (Line2);
	if (*Line2 == '\"')
	{
		data = ++Line2;
		while (*data && *data != '\"')
			data++;
		*data = 0;
	}

	if (*Line2 == 0)
	{
		Printf ("Include directive is missing filename\n");
	}
	else
	{
		data = Line2;
		DPrintf (DMSG_SPAMMY, "Including %s\n", data);
		savepatchname = PatchName;
		savepatchfile = PatchFile;
		savepatchpt = PatchPt;
		savepatchsize = PatchSize;
		savedversion = dversion;
		savepversion = pversion;
		including = true;

		// Try looking for the included file in the same directory
		// as the patch before looking in the current file.
		const char *lastSlash = savepatchname ? strrchr (savepatchname, '/') : NULL;
		char *path = data;

		if (lastSlash != NULL)
		{
			size_t pathlen = lastSlash - savepatchname + strlen (data) + 2;
			path = new char[pathlen];
			strncpy (path, savepatchname, (lastSlash - savepatchname) + 1);
			strcpy (path + (lastSlash - savepatchname) + 1, data);
			if (!FileExists (path))
			{
				delete[] path;
				path = data;
			}
		}

		D_LoadDehFile(path);

		if (data != path)
		{
			delete[] path;
		}

		DPrintf (DMSG_SPAMMY, "Done with include\n");
		PatchName = savepatchname;
		PatchFile = savepatchfile;
		PatchPt = savepatchpt;
		PatchSize = savepatchsize;
		dversion = savedversion;
		pversion = savepversion;
	}

	including = false;
	includenotext = false;
	return GetLine();
}